

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

QString * architectureFromName(QString *__return_storage_ptr__,QString *name)

{
  long lVar1;
  char cVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  QRegularExpressionMatch match;
  QRegularExpression architecture;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _architecture = 0xaaaaaaaaaaaaaaaa;
  _match = (Data *)0x0;
  local_70.d = (Data *)0x0;
  local_70.ptr = (char16_t *)0x0;
  local_70.size = 0;
  QRegularExpression::QRegularExpression(&architecture,(QArrayDataPointer<char16_t> *)&match,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&match);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  _match = (Data *)0xaaaaaaaaaaaaaaaa;
  QRegularExpression::match(&match,&architecture,name,0,0,0);
  cVar2 = QRegularExpressionMatch::hasMatch();
  if (cVar2 == '\0') {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QRegularExpressionMatch::captured((int)__return_storage_ptr__);
  }
  QRegularExpressionMatch::~QRegularExpressionMatch(&match);
  QRegularExpression::~QRegularExpression(&architecture);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString architectureFromName(const QString &name)
{
    QRegularExpression architecture(QStringLiteral("_(armeabi-v7a|arm64-v8a|x86|x86_64).so$"));
    auto match = architecture.match(name);
    if (!match.hasMatch())
        return {};
    return match.captured(1);
}